

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::doEndBranch(SpillPointers *self,Expression **currp)

{
  BasicBlock *__from;
  bool bVar1;
  reference pNVar2;
  mapped_type *this;
  BasicBlock *__to;
  LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this_00;
  BasicBlock *last;
  size_t local_98;
  char *pcStack_90;
  Expression *local_80;
  size_t sStack_78;
  Name target;
  iterator __end2;
  iterator __begin2;
  NameSet *__range2;
  NameSet branchTargets;
  Expression *curr;
  Expression **currp_local;
  SpillPointers *self_local;
  
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*currp;
  BranchUtils::getUniqueTargets
            ((NameSet *)&__range2,
             (Expression *)branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __end2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                     ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                      &__range2);
  target.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                          &__range2);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&target.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar2 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2);
    local_98 = (pNVar2->super_IString).str._M_len;
    pcStack_90 = (pNVar2->super_IString).str._M_str;
    sStack_78 = local_98;
    target.super_IString.str._M_len = (size_t)pcStack_90;
    local_80 = ControlFlowWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
               findBreakTarget((ControlFlowWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                *)&(self->
                                   super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                                   ).
                                   super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                               ,(Name)(pNVar2->super_IString).str);
    this = std::
           map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
           ::operator[](&(self->
                         super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                         ).
                         super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                         .
                         super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                         .branches,&local_80);
    std::
    vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::push_back(this,&(self->
                      super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                      .
                      super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                      .currBasicBlock);
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2);
  }
  last._0_4_ = 1;
  bVar1 = wasm::Type::operator!=
                    ((Type *)(branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8),
                     (BasicType *)&last);
  if (bVar1) {
    __from = (self->
             super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
             ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
             super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
             .currBasicBlock;
    this_00 = &(self->
               super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
               ).
               super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>;
    __to = startBasicBlock(&this_00->
                            super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                          );
    link(&this_00->
          super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
         ,(char *)__from,(char *)__to);
  }
  else {
    startUnreachableBlock
              (&(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                .
                super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
              );
  }
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range2);
  return;
}

Assistant:

static void doEndBranch(SubType* self, Expression** currp) {
    auto* curr = *currp;
    auto branchTargets = BranchUtils::getUniqueTargets(curr);
    // Add branches to the targets.
    for (auto target : branchTargets) {
      self->branches[self->findBreakTarget(target)].push_back(
        self->currBasicBlock);
    }
    if (curr->type != Type::unreachable) {
      auto* last = self->currBasicBlock;
      self->link(last, self->startBasicBlock()); // we might fall through
    } else {
      self->startUnreachableBlock();
    }
  }